

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRExpression * __thiscall
spirv_cross::CompilerGLSL::emit_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,string *rhs,bool forwarding,
          bool suppress_usage_tracking)

{
  uint32_t id;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar1;
  bool local_ba;
  bool local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  bool local_61;
  _Node_iterator_base<unsigned_int,_false> local_60;
  undefined1 local_58;
  _Node_iterator_base<unsigned_int,_false> local_50;
  undefined1 local_48;
  _Node_iterator_base<unsigned_int,_false> local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  byte local_2a;
  undefined1 local_29;
  bool suppress_usage_tracking_local;
  string *psStack_28;
  bool forwarding_local;
  string *rhs_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_ba = false;
  local_2a = suppress_usage_tracking;
  local_29 = forwarding;
  psStack_28 = rhs;
  rhs_local._0_4_ = result_id;
  rhs_local._4_4_ = result_type;
  _result_id_local = this;
  if (forwarding) {
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&(this->super_Compiler).forced_temporaries,(key_type *)&rhs_local);
    local_40._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).forced_temporaries);
    local_ba = ::std::__detail::operator==(&local_38,&local_40);
  }
  if (local_ba == false) {
    declare_temporary_abi_cxx11_(&local_88,this,rhs_local._4_4_,(uint32_t)rhs_local);
    statement<std::__cxx11::string,std::__cxx11::string_const&,char_const(&)[2]>
              (this,&local_88,psStack_28,(char (*) [2])0x5abb6c);
    ::std::__cxx11::string::~string((string *)&local_88);
    id = (uint32_t)rhs_local;
    (*(this->super_Compiler)._vptr_Compiler[6])();
    local_b9 = true;
    this_local = (CompilerGLSL *)
                 Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                           (&this->super_Compiler,id,&local_b8,(uint *)((long)&rhs_local + 4),
                            &local_b9);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    pVar1 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_Compiler).forwarded_temporaries,(value_type *)&rhs_local);
    local_50._M_cur =
         (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_48 = pVar1.second;
    if ((local_2a & 1) != 0) {
      pVar1 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).suppressed_usage_tracking,(value_type *)&rhs_local);
      local_60._M_cur =
           (__node_type *)pVar1.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_58 = pVar1.second;
    }
    local_61 = true;
    this_local = (CompilerGLSL *)
                 Compiler::
                 set<spirv_cross::SPIRExpression,std::__cxx11::string_const&,unsigned_int&,bool>
                           (&this->super_Compiler,(uint32_t)rhs_local,psStack_28,
                            (uint *)((long)&rhs_local + 4),&local_61);
  }
  return (SPIRExpression *)this_local;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_op(uint32_t result_type, uint32_t result_id, const string &rhs, bool forwarding,
                                      bool suppress_usage_tracking)
{
	if (forwarding && (forced_temporaries.find(result_id) == end(forced_temporaries)))
	{
		// Just forward it without temporary.
		// If the forward is trivial, we do not force flushing to temporary for this expression.
		forwarded_temporaries.insert(result_id);
		if (suppress_usage_tracking)
			suppressed_usage_tracking.insert(result_id);

		return set<SPIRExpression>(result_id, rhs, result_type, true);
	}
	else
	{
		// If expression isn't immutable, bind it to a temporary and make the new temporary immutable (they always are).
		statement(declare_temporary(result_type, result_id), rhs, ";");
		return set<SPIRExpression>(result_id, to_name(result_id), result_type, true);
	}
}